

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void page_size_init_x86_64(uc_struct_conflict *uc)

{
  ulong uVar1;
  
  uVar1 = uc->qemu_host_page_size;
  if (uVar1 == 0) {
    uVar1 = uc->qemu_real_host_page_size;
    uc->qemu_host_page_size = uVar1;
  }
  if (uVar1 < 0x1000) {
    uc->qemu_host_page_size = 0x1000;
  }
  return;
}

Assistant:

void page_size_init(struct uc_struct *uc)
{
    /* NOTE: we can always suppose that qemu_host_page_size >=
       TARGET_PAGE_SIZE */
    if (uc->qemu_host_page_size == 0) {
        uc->qemu_host_page_size = uc->qemu_real_host_page_size;
    }
    if (uc->qemu_host_page_size < TARGET_PAGE_SIZE) {
        uc->qemu_host_page_size = TARGET_PAGE_SIZE;
    }
}